

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_EB2_Level.H
# Opt level: O1

void __thiscall amrex::EB2::Level::Level(Level *this,IndexSpace *is,Geometry *geom)

{
  long lVar1;
  
  memcpy(this,geom,200);
  (this->m_ngrow).vect[0] = 0;
  (this->m_ngrow).vect[1] = 0;
  (this->m_ngrow).vect[2] = 0;
  BoxArray::BoxArray(&this->m_grids);
  BoxArray::BoxArray(&this->m_covered_grids);
  DistributionMapping::DistributionMapping(&this->m_dmap);
  FabArrayBase::FabArrayBase((FabArrayBase *)&this->m_mgf);
  *(undefined8 *)
   ((long)&(this->m_mgf).super_LayoutData<amrex::EB2::GFab>.m_data.
           super_vector<amrex::EB2::GFab,_std::allocator<amrex::EB2::GFab>_>.
           super__Vector_base<amrex::EB2::GFab,_std::allocator<amrex::EB2::GFab>_>._M_impl.
           super__Vector_impl_data + 9) = 0;
  *(undefined8 *)
   ((long)&(this->m_mgf).super_LayoutData<amrex::EB2::GFab>.m_data.
           super_vector<amrex::EB2::GFab,_std::allocator<amrex::EB2::GFab>_>.
           super__Vector_base<amrex::EB2::GFab,_std::allocator<amrex::EB2::GFab>_>._M_impl.
           super__Vector_impl_data + 0x11) = 0;
  (this->m_mgf).super_LayoutData<amrex::EB2::GFab>.m_data.
  super_vector<amrex::EB2::GFab,_std::allocator<amrex::EB2::GFab>_>.
  super__Vector_base<amrex::EB2::GFab,_std::allocator<amrex::EB2::GFab>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)&(this->m_mgf).super_LayoutData<amrex::EB2::GFab>.m_data.
           super_vector<amrex::EB2::GFab,_std::allocator<amrex::EB2::GFab>_>.
           super__Vector_base<amrex::EB2::GFab,_std::allocator<amrex::EB2::GFab>_>._M_impl.
           super__Vector_impl_data + 8) = (pointer)0x0;
  (this->m_mgf).super_LayoutData<amrex::EB2::GFab>.super_FabArrayBase._vptr_FabArrayBase =
       (_func_int **)&PTR__LayoutData_0074ef40;
  MultiFab::MultiFab(&this->m_levelset);
  FabArray<amrex::EBCellFlagFab>::FabArray(&this->m_cellflag);
  MultiFab::MultiFab(&this->m_volfrac);
  MultiFab::MultiFab(&this->m_centroid);
  MultiFab::MultiFab(&this->m_bndryarea);
  MultiFab::MultiFab(&this->m_bndrycent);
  MultiFab::MultiFab(&this->m_bndrynorm);
  lVar1 = 0;
  do {
    MultiFab::MultiFab((MultiFab *)
                       ((long)&(this->m_areafrac)._M_elems[0].super_FabArray<amrex::FArrayBox>.
                               super_FabArrayBase._vptr_FabArrayBase + lVar1));
    lVar1 = lVar1 + 0x180;
  } while (lVar1 != 0x480);
  lVar1 = 0;
  do {
    MultiFab::MultiFab((MultiFab *)
                       ((long)&(this->m_facecent)._M_elems[0].super_FabArray<amrex::FArrayBox>.
                               super_FabArrayBase._vptr_FabArrayBase + lVar1));
    lVar1 = lVar1 + 0x180;
  } while (lVar1 != 0x480);
  lVar1 = 0;
  do {
    MultiFab::MultiFab((MultiFab *)
                       ((long)&(this->m_edgecent)._M_elems[0].super_FabArray<amrex::FArrayBox>.
                               super_FabArrayBase._vptr_FabArrayBase + lVar1));
    lVar1 = lVar1 + 0x180;
  } while (lVar1 != 0x480);
  this->m_allregular = false;
  this->m_ok = false;
  this->m_parent = is;
  return;
}

Assistant:

Level (IndexSpace const* is, const Geometry& geom) : m_geom(geom), m_parent(is) {}